

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int aom_flat_block_finder_run
              (aom_flat_block_finder_t *block_finder,uint8_t *data,int w,int h,int stride,
              uint8_t *flat_blocks)

{
  size_t size;
  int iVar1;
  double *plane;
  double *block;
  void *__base;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  double *pdVar5;
  double *pdVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  size_t __nmemb;
  uint uVar15;
  int iVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  
  iVar1 = block_finder->block_size;
  lVar11 = (long)iVar1;
  uVar15 = iVar1 * iVar1;
  uVar10 = (iVar1 + w + -1) / iVar1;
  uVar8 = (iVar1 + h + -1) / iVar1;
  size = (ulong)uVar15 * 8;
  plane = (double *)aom_malloc(size);
  block = (double *)aom_malloc(size);
  iVar9 = uVar8 * uVar10;
  __nmemb = (size_t)iVar9;
  __base = aom_malloc(__nmemb * 8);
  if (((plane == (double *)0x0) || (block == (double *)0x0)) || (__base == (void *)0x0)) {
    fprintf(_stderr,"Failed to allocate memory for block of size %d\n",(ulong)uVar15);
    iVar16 = -1;
    pdVar5 = block;
    block = plane;
  }
  else {
    if ((int)uVar8 < 1) {
      iVar16 = 0;
    }
    else {
      dVar18 = (double)((iVar1 + -2) * (iVar1 + -2));
      uVar3 = 0;
      iVar16 = 0;
      do {
        if (0 < (int)uVar10) {
          uVar13 = 0;
          do {
            aom_flat_block_finder_extract_block
                      (block_finder,data,w,h,stride,iVar1 * (int)uVar13,(int)uVar3 * iVar1,plane,
                       block);
            dVar26 = 0.0;
            dVar27 = 0.0;
            dVar28 = 0.0;
            if (iVar1 < 3) {
              dVar19 = 0.0;
              dVar20 = 0.0;
            }
            else {
              uVar2 = 1;
              dVar19 = 0.0;
              dVar20 = 0.0;
              pdVar5 = block;
              pdVar6 = block + lVar11 + 2;
              pdVar12 = block + lVar11 * 2 + 1;
              do {
                lVar14 = 0;
                do {
                  dVar25 = pdVar6[lVar14 + -1];
                  dVar23 = (pdVar6[lVar14] - pdVar6[lVar14 + -2]) * 0.5;
                  dVar24 = (pdVar12[lVar14] - pdVar5[lVar14 + 1]) * 0.5;
                  dVar28 = dVar28 + dVar25;
                  dVar19 = dVar19 + dVar23 * dVar23;
                  dVar20 = dVar20 + dVar23 * dVar24;
                  dVar26 = dVar26 + dVar25 * dVar25;
                  dVar27 = dVar27 + dVar24 * dVar24;
                  lVar14 = lVar14 + 1;
                } while ((ulong)(iVar1 - 1) - 1 != lVar14);
                uVar2 = uVar2 + 1;
                pdVar12 = pdVar12 + lVar11;
                pdVar6 = pdVar6 + lVar11;
                pdVar5 = pdVar5 + lVar11;
              } while (uVar2 != iVar1 - 1);
            }
            auVar21._8_8_ = dVar19;
            auVar21._0_8_ = dVar27;
            auVar22._8_8_ = dVar18;
            auVar22._0_8_ = dVar18;
            auVar22 = divpd(auVar21,auVar22);
            dVar25 = auVar22._0_8_ + auVar22._8_8_;
            dVar20 = dVar25 * dVar25 +
                     (auVar22._8_8_ * auVar22._0_8_ - (dVar20 / dVar18) * (dVar20 / dVar18)) * -4.0;
            dVar19 = SQRT(dVar20);
            dVar27 = dVar19;
            if (dVar20 < 0.0) {
              dVar27 = sqrt(dVar20);
            }
            dVar28 = dVar26 / dVar18 - (dVar28 / dVar18) * (dVar28 / dVar18);
            dVar26 = (dVar27 + dVar25) * 0.5;
            if (dVar20 < 0.0) {
              dVar19 = sqrt(dVar20);
            }
            dVar27 = (dVar25 - dVar19) * 0.5;
            if (dVar27 <= 1e-06) {
              dVar27 = 1e-06;
            }
            dVar19 = dVar26 * -12434.0 +
                     dVar25 * 13087.0 + dVar28 * -6682.0 + (dVar26 / dVar27) * -0.2056 + 2.5694;
            dVar19 = exp((double)(-(ulong)(dVar19 < -25.0) & 0x4039000000000000 |
                                 ~-(ulong)(dVar19 < -25.0) &
                                 (-(ulong)(100.0 < dVar19) & 0xc059000000000000 |
                                 ~-(ulong)(100.0 < dVar19) & (ulong)-dVar19)));
            if (0.005 / (double)(int)uVar15 < dVar28) {
              fVar17 = (float)(1.0 / (dVar19 + 1.0));
            }
            else {
              fVar17 = 0.0;
            }
            bVar7 = dVar25 < 0.000146484375 & -(dVar26 / dVar27 < 1.25) & -(dVar26 < 7.8125e-05) &
                    0.005 / (double)(int)uVar15 < dVar28;
            iVar16 = iVar16 + (uint)bVar7;
            lVar14 = uVar3 * uVar10 + uVar13;
            flat_blocks[lVar14] = -bVar7;
            *(float *)((long)__base + lVar14 * 8 + 4) = fVar17;
            *(int *)((long)__base + lVar14 * 8) = (int)lVar14;
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar10);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar8);
    }
    qsort(__base,__nmemb,8,compare_scores);
    pdVar5 = plane;
    if (0 < iVar9) {
      fVar17 = *(float *)((long)__base + (long)((iVar9 * 0x5a) / 100) * 8 + 4);
      sVar4 = 0;
      do {
        if (fVar17 <= *(float *)((long)__base + sVar4 * 8 + 4)) {
          iVar1 = *(int *)((long)__base + sVar4 * 8);
          iVar16 = iVar16 + (uint)(flat_blocks[iVar1] == 0);
          flat_blocks[iVar1] = flat_blocks[iVar1] | 1;
        }
        sVar4 = sVar4 + 1;
      } while (__nmemb != sVar4);
    }
  }
  aom_free(block);
  aom_free(pdVar5);
  aom_free(__base);
  return iVar16;
}

Assistant:

int aom_flat_block_finder_run(const aom_flat_block_finder_t *block_finder,
                              const uint8_t *const data, int w, int h,
                              int stride, uint8_t *flat_blocks) {
  // The gradient-based features used in this code are based on:
  //  A. Kokaram, D. Kelly, H. Denman and A. Crawford, "Measuring noise
  //  correlation for improved video denoising," 2012 19th, ICIP.
  // The thresholds are more lenient to allow for correct grain modeling
  // if extreme cases.
  const int block_size = block_finder->block_size;
  const int n = block_size * block_size;
  const double kTraceThreshold = 0.15 / (32 * 32);
  const double kRatioThreshold = 1.25;
  const double kNormThreshold = 0.08 / (32 * 32);
  const double kVarThreshold = 0.005 / (double)n;
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  int num_flat = 0;
  double *plane = (double *)aom_malloc(n * sizeof(*plane));
  double *block = (double *)aom_malloc(n * sizeof(*block));
  index_and_score_t *scores = (index_and_score_t *)aom_malloc(
      num_blocks_w * num_blocks_h * sizeof(*scores));
  if (plane == NULL || block == NULL || scores == NULL) {
    fprintf(stderr, "Failed to allocate memory for block of size %d\n", n);
    aom_free(plane);
    aom_free(block);
    aom_free(scores);
    return -1;
  }

#ifdef NOISE_MODEL_LOG_SCORE
  fprintf(stderr, "score = [");
#endif
  for (int by = 0; by < num_blocks_h; ++by) {
    for (int bx = 0; bx < num_blocks_w; ++bx) {
      // Compute gradient covariance matrix.
      aom_flat_block_finder_extract_block(block_finder, data, w, h, stride,
                                          bx * block_size, by * block_size,
                                          plane, block);
      double Gxx = 0, Gxy = 0, Gyy = 0;
      double mean = 0;
      double var = 0;

      for (int yi = 1; yi < block_size - 1; ++yi) {
        for (int xi = 1; xi < block_size - 1; ++xi) {
          const double gx = (block[yi * block_size + xi + 1] -
                             block[yi * block_size + xi - 1]) /
                            2;
          const double gy = (block[yi * block_size + xi + block_size] -
                             block[yi * block_size + xi - block_size]) /
                            2;
          Gxx += gx * gx;
          Gxy += gx * gy;
          Gyy += gy * gy;

          const double value = block[yi * block_size + xi];
          mean += value;
          var += value * value;
        }
      }
      mean /= (block_size - 2) * (block_size - 2);

      // Normalize gradients by block_size.
      Gxx /= ((block_size - 2) * (block_size - 2));
      Gxy /= ((block_size - 2) * (block_size - 2));
      Gyy /= ((block_size - 2) * (block_size - 2));
      var = var / ((block_size - 2) * (block_size - 2)) - mean * mean;

      {
        const double trace = Gxx + Gyy;
        const double det = Gxx * Gyy - Gxy * Gxy;
        const double e1 = (trace + sqrt(trace * trace - 4 * det)) / 2.;
        const double e2 = (trace - sqrt(trace * trace - 4 * det)) / 2.;
        const double norm = e1;  // Spectral norm
        const double ratio = (e1 / AOMMAX(e2, 1e-6));
        const int is_flat = (trace < kTraceThreshold) &&
                            (ratio < kRatioThreshold) &&
                            (norm < kNormThreshold) && (var > kVarThreshold);
        // The following weights are used to combine the above features to give
        // a sigmoid score for flatness. If the input was normalized to [0,100]
        // the magnitude of these values would be close to 1 (e.g., weights
        // corresponding to variance would be a factor of 10000x smaller).
        // The weights are given in the following order:
        //    [{var}, {ratio}, {trace}, {norm}, offset]
        // with one of the most discriminative being simply the variance.
        const double weights[5] = { -6682, -0.2056, 13087, -12434, 2.5694 };
        double sum_weights = weights[0] * var + weights[1] * ratio +
                             weights[2] * trace + weights[3] * norm +
                             weights[4];
        // clamp the value to [-25.0, 100.0] to prevent overflow
        sum_weights = fclamp(sum_weights, -25.0, 100.0);
        const float score = (float)(1.0 / (1 + exp(-sum_weights)));
        flat_blocks[by * num_blocks_w + bx] = is_flat ? 255 : 0;
        scores[by * num_blocks_w + bx].score = var > kVarThreshold ? score : 0;
        scores[by * num_blocks_w + bx].index = by * num_blocks_w + bx;
#ifdef NOISE_MODEL_LOG_SCORE
        fprintf(stderr, "%g %g %g %g %g %d ", score, var, ratio, trace, norm,
                is_flat);
#endif
        num_flat += is_flat;
      }
    }
#ifdef NOISE_MODEL_LOG_SCORE
    fprintf(stderr, "\n");
#endif
  }
#ifdef NOISE_MODEL_LOG_SCORE
  fprintf(stderr, "];\n");
#endif
  // Find the top-scored blocks (most likely to be flat) and set the flat blocks
  // be the union of the thresholded results and the top 10th percentile of the
  // scored results.
  qsort(scores, num_blocks_w * num_blocks_h, sizeof(*scores), &compare_scores);
  const int top_nth_percentile = num_blocks_w * num_blocks_h * 90 / 100;
  const float score_threshold = scores[top_nth_percentile].score;
  for (int i = 0; i < num_blocks_w * num_blocks_h; ++i) {
    if (scores[i].score >= score_threshold) {
      num_flat += flat_blocks[scores[i].index] == 0;
      flat_blocks[scores[i].index] |= 1;
    }
  }
  aom_free(block);
  aom_free(plane);
  aom_free(scores);
  return num_flat;
}